

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merlin.cpp
# Opt level: O2

int __thiscall Merlin::init(Merlin *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  undefined8 extraout_RAX;
  double dVar2;
  double dVar3;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  dVar2 = merlin::timeSystem();
  if (this->m_useFiles == true) {
    bVar1 = read_model(this,(this->m_modelFile)._M_dataplus._M_p);
    if ((((bVar1) &&
         (((this->m_evidenceFile)._M_string_length == 0 ||
          (bVar1 = read_evidence(this,(this->m_evidenceFile)._M_dataplus._M_p), bVar1)))) &&
        (((this->m_virtualEvidenceFile)._M_string_length == 0 ||
         (bVar1 = read_virtual_evidence(this,(this->m_virtualEvidenceFile)._M_dataplus._M_p), bVar1)
         ))) && ((((this->m_queryFile)._M_string_length == 0 ||
                  (bVar1 = read_query(this,(this->m_queryFile)._M_dataplus._M_p), bVar1)) &&
                 (((this->m_datasetFile)._M_string_length == 0 ||
                  (bVar1 = read_dataset(this,(this->m_datasetFile)._M_dataplus._M_p), bVar1)))))) {
LAB_001651c5:
      dVar3 = merlin::timeSystem();
      this->m_ioTime = dVar3 - dVar2;
      return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_38,(string *)&this->m_modelString);
    bVar1 = read_model(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (bVar1) {
      if ((this->m_evidenceString)._M_string_length == 0) {
        std::__cxx11::string::string((string *)&local_58,(string *)&this->m_evidenceString);
        bVar1 = read_evidence(this,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        if (!bVar1) {
          return 0;
        }
      }
      if ((this->m_virtualEvidenceString)._M_string_length == 0) {
        std::__cxx11::string::string((string *)&local_78,(string *)&this->m_virtualEvidenceString);
        bVar1 = read_virtual_evidence(this,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        if (!bVar1) {
          return 0;
        }
      }
      if ((this->m_queryString)._M_string_length != 0) {
        std::__cxx11::string::string((string *)&local_98,(string *)&this->m_queryString);
        bVar1 = read_query(this,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        if (!bVar1) {
          return 0;
        }
      }
      if ((this->m_datasetString)._M_string_length != 0) {
        std::__cxx11::string::string((string *)&local_b8,(string *)&this->m_datasetString);
        bVar1 = read_dataset(this,&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        if (!bVar1) {
          return 0;
        }
      }
      goto LAB_001651c5;
    }
  }
  return 0;
}

Assistant:

bool Merlin::init() {

	double timestamp = merlin::timeSystem();
	if (m_useFiles) { // input files
		if (!read_model(m_modelFile.c_str())) {
			return false;
		}
		if (m_evidenceFile.empty() == false) {
			if (!read_evidence(m_evidenceFile.c_str())) {
				return false;
			}
		}
		if (m_virtualEvidenceFile.empty() == false) {
			if (!read_virtual_evidence(m_virtualEvidenceFile.c_str())) {
				return false;
			}
		}
		if (m_queryFile.empty() == false) {
			if (!read_query(m_queryFile.c_str())) {
				return false;
			}
		}
		if (m_datasetFile.empty() == false) {
			if (!read_dataset(m_datasetFile.c_str())) {
				return false;
			}
		}
	} else { // input strings
		if (!read_model(m_modelString)) {
			return false;
		}
		if (m_evidenceString.empty()) {
			if (!read_evidence(m_evidenceString)) {
				return false;
			}
		}
		if (m_virtualEvidenceString.empty()) {
			if (!read_virtual_evidence(m_virtualEvidenceString)) {
				return false;
			}
		}
		if (!m_queryString.empty()) {
			if (!read_query(m_queryString)) {
				return false;
			}
		}
		if (!m_datasetString.empty()) {
			if (!read_dataset(m_datasetString)) {
				return false;
			}
		}
	}

	m_ioTime = (merlin::timeSystem() - timestamp);
	return true;
}